

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O2

int check_pointer(Pointer *ptr,char *name)

{
  undefined1 dot;
  char *__s;
  
  dot = SUB81(name,0);
  printf("target %s=");
  printName(ptr->target,(bool)dot);
  if (ptr->target == dg::pta::UNKNOWN_MEMORY) {
    __s = "Unknown Ptr";
  }
  else {
    if (ptr->target != dg::pta::NULLPTR) {
      putchar(10);
      return 1;
    }
    __s = "Null Ptr";
  }
  puts(__s);
  return 2;
}

Assistant:

static int check_pointer(const Pointer &ptr, const char *name) {
    printf("target %s=", name);
    printName(ptr.target, false);
    if (ptr.isUnknown()) {
        printf("Unknown Ptr\n");
        return MayAlias;
    }
    if (ptr.isNull()) {
        printf("Null Ptr\n");
        return MayAlias;
    }
    printf("\n");
    return NoAlias;
}